

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O3

TRef fold_kfold_strto(jit_State *J)

{
  StrScanFmt SVar1;
  TRef TVar2;
  cTValue *tv;
  TValue n;
  TValue local_10;
  
  SVar1 = lj_strscan_scan((uint8_t *)((ulong)(J->fold).left.field_1.op12 + 0x10),&local_10,2);
  if (SVar1 != STRSCAN_ERROR) {
    tv = lj_ir_k64_find(J,local_10.u64);
    TVar2 = lj_ir_k64(J,IR_KNUM,tv);
    return TVar2;
  }
  return 3;
}

Assistant:

LJFOLD(STRTO KGC)
LJFOLDF(kfold_strto)
{
  TValue n;
  if (lj_strscan_num(ir_kstr(fleft), &n))
    return lj_ir_knum(J, numV(&n));
  return FAILFOLD;
}